

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_448ecb::DeleteExpr::printLeft(DeleteExpr *this,OutputStream *S)

{
  char *pcVar1;
  size_t sVar2;
  Node *pNVar3;
  
  if (this->IsGlobal == true) {
    OutputStream::grow(S,2);
    pcVar1 = S->Buffer;
    sVar2 = S->CurrentPosition;
    (pcVar1 + sVar2)[0] = ':';
    (pcVar1 + sVar2)[1] = ':';
    S->CurrentPosition = S->CurrentPosition + 2;
  }
  OutputStream::grow(S,6);
  builtin_strncpy(S->Buffer + S->CurrentPosition,"delete",6);
  S->CurrentPosition = S->CurrentPosition + 6;
  if (this->IsArray == true) {
    OutputStream::grow(S,3);
    pcVar1 = S->Buffer;
    sVar2 = S->CurrentPosition;
    pcVar1[sVar2 + 2] = ' ';
    pcVar1 = pcVar1 + sVar2;
    pcVar1[0] = '[';
    pcVar1[1] = ']';
    S->CurrentPosition = S->CurrentPosition + 3;
  }
  pNVar3 = this->Op;
  (*pNVar3->_vptr_Node[4])(pNVar3,S);
  if (pNVar3->RHSComponentCache == No) {
    return;
  }
  (*pNVar3->_vptr_Node[5])(pNVar3,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (IsGlobal)
      S += "::";
    S += "delete";
    if (IsArray)
      S += "[] ";
    Op->print(S);
  }